

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O3

CVmVarHeapHybrid_hdr * __thiscall
CVmVarHeapHybrid_malloc::alloc(CVmVarHeapHybrid_malloc *this,size_t siz)

{
  CVmVarHeapHybrid_hdr *pCVar1;
  
  pCVar1 = (CVmVarHeapHybrid_hdr *)malloc(siz + 0xf & 0xfffffffffffffff8);
  pCVar1->block = &this->super_CVmVarHeapHybrid_block;
  return pCVar1;
}

Assistant:

virtual struct CVmVarHeapHybrid_hdr *alloc(size_t siz)
    {
        CVmVarHeapHybrid_hdr *ptr;
        
        /* adjust the size to add in the required header */
        siz = osrndsz(siz + sizeof(CVmVarHeapHybrid_hdr));
        
        /* allocate directly via the default system heap manager */
        ptr = (CVmVarHeapHybrid_hdr *)t3malloc(siz);

        /* fill in the header */
        ptr->block = this;

        /* return the new block */
        return ptr;
    }